

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_168b90f::LowBDConvolveHorizRSTest_Correctness_Test::TestBody
          (LowBDConvolveHorizRSTest_Correctness_Test *this)

{
  ConvolveHorizRSTestBase<unsigned_char> *in_stack_00000080;
  
  ConvolveHorizRSTestBase<unsigned_char>::CorrectnessTest(in_stack_00000080);
  return;
}

Assistant:

TEST_P(LowBDConvolveHorizRSTest, Correctness) { CorrectnessTest(); }